

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_collision.h
# Opt level: O2

void __thiscall GIM_AABB::merge(GIM_AABB *this,GIM_AABB *box)

{
  btScalar *pbVar1;
  float fVar2;
  GIM_AABB *pGVar3;
  btVector3 *pbVar4;
  float fVar5;
  
  fVar5 = (box->m_min).m_floats[0];
  fVar2 = (this->m_min).m_floats[0];
  if (fVar2 <= fVar5) {
    fVar5 = fVar2;
  }
  (this->m_min).m_floats[0] = fVar5;
  fVar5 = (this->m_min).m_floats[1];
  fVar2 = (this->m_min).m_floats[2];
  pbVar1 = (box->m_min).m_floats + 1;
  pGVar3 = this;
  if (*pbVar1 <= fVar5 && fVar5 != *pbVar1) {
    pGVar3 = box;
  }
  (this->m_min).m_floats[1] = (pGVar3->m_min).m_floats[1];
  pbVar1 = (box->m_min).m_floats + 2;
  pGVar3 = this;
  if (*pbVar1 <= fVar2 && fVar2 != *pbVar1) {
    pGVar3 = box;
  }
  (this->m_min).m_floats[2] = (pGVar3->m_min).m_floats[2];
  fVar5 = (box->m_max).m_floats[0];
  fVar2 = (this->m_max).m_floats[0];
  if (fVar5 <= fVar2) {
    fVar5 = fVar2;
  }
  (this->m_max).m_floats[0] = fVar5;
  fVar5 = (box->m_max).m_floats[1];
  pbVar1 = (this->m_max).m_floats + 1;
  pbVar4 = &this->m_max;
  if (*pbVar1 <= fVar5 && fVar5 != *pbVar1) {
    pbVar4 = &box->m_max;
  }
  (this->m_max).m_floats[1] = pbVar4->m_floats[1];
  fVar5 = (box->m_max).m_floats[2];
  pbVar1 = (this->m_max).m_floats + 2;
  pbVar4 = &this->m_max;
  if (*pbVar1 <= fVar5 && fVar5 != *pbVar1) {
    pbVar4 = &box->m_max;
  }
  (this->m_max).m_floats[2] = pbVar4->m_floats[2];
  return;
}

Assistant:

SIMD_FORCE_INLINE void merge(const GIM_AABB & box)
	{
		m_min[0] = GIM_MIN(m_min[0],box.m_min[0]);
		m_min[1] = GIM_MIN(m_min[1],box.m_min[1]);
		m_min[2] = GIM_MIN(m_min[2],box.m_min[2]);

		m_max[0] = GIM_MAX(m_max[0],box.m_max[0]);
		m_max[1] = GIM_MAX(m_max[1],box.m_max[1]);
		m_max[2] = GIM_MAX(m_max[2],box.m_max[2]);
	}